

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::intersect(BoxList *this,BoxList *bl)

{
  BoxList *in_RDI;
  BoxList *in_stack_00000020;
  BoxArray *in_stack_00000028;
  BoxArray *this_00;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  
  this_00 = (BoxArray *)&stack0xffffffffffffff68;
  BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffff80,(BoxList *)in_stack_ffffffffffffff78);
  amrex::intersect(in_stack_00000028,in_stack_00000020);
  operator=((BoxList *)this_00,in_RDI);
  ~BoxList((BoxList *)0xfa9a5c);
  BoxArray::~BoxArray(this_00);
  return in_RDI;
}

Assistant:

BoxList&
BoxList::intersect (const BoxList& bl)
{
    BL_ASSERT(ixType() == bl.ixType());
    *this = amrex::intersect(BoxArray{*this}, bl);
    return *this;
}